

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::ForceManager::preCalculation(ForceManager *this)

{
  Snapshot *this_00;
  Molecule *pMVar1;
  Mat3x3d *pMVar2;
  uint i;
  long lVar3;
  uint j;
  long lVar4;
  Atom *this_01;
  RigidBody *this_02;
  CutoffGroup *this_03;
  pointer ppAVar5;
  pointer ppRVar6;
  pointer ppCVar7;
  MoleculeIterator mi;
  MoleculeIterator local_158;
  SelectionSet local_150;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  potVec local_118;
  potVec local_d8;
  potVec local_98;
  potVec local_58;
  
  local_158._M_node = (_Base_ptr)0x0;
  this_00 = this->info_->sman_->currentSnapshot_;
  (*this->fDecomp_->_vptr_ForceDecomposition[2])(this->fDecomp_,this_00);
  Snapshot::setBondPotential(this_00,0.0);
  Snapshot::setBendPotential(this_00,0.0);
  Snapshot::setTorsionPotential(this_00,0.0);
  Snapshot::setInversionPotential(this_00,0.0);
  local_58.data_[6] = 0.0;
  local_58.data_[4] = 0.0;
  local_58.data_[5] = 0.0;
  local_58.data_[2] = 0.0;
  local_58.data_[3] = 0.0;
  local_58.data_[0] = 0.0;
  local_58.data_[1] = 0.0;
  Snapshot::setLongRangePotentials(this_00,&local_58);
  local_98.data_[6] = 0.0;
  local_98.data_[4] = 0.0;
  local_98.data_[5] = 0.0;
  local_98.data_[2] = 0.0;
  local_98.data_[3] = 0.0;
  local_98.data_[0] = 0.0;
  local_98.data_[1] = 0.0;
  Snapshot::setExcludedPotentials(this_00,&local_98);
  if (this->doPotentialSelection_ == true) {
    local_d8.data_[4] = 0.0;
    local_d8.data_[5] = 0.0;
    local_d8.data_[2] = 0.0;
    local_d8.data_[3] = 0.0;
    local_d8.data_[0] = 0.0;
    local_d8.data_[1] = 0.0;
    local_d8.data_[6] = 0.0;
    Snapshot::setSelectionPotentials(this_00,&local_d8);
  }
  local_118.data_[4] = 0.0;
  local_118.data_[5] = 0.0;
  local_118.data_[2] = 0.0;
  local_118.data_[3] = 0.0;
  local_118.data_[0] = 0.0;
  local_118.data_[1] = 0.0;
  local_118.data_[6] = 0.0;
  Snapshot::setSelfPotentials(this_00,&local_118);
  Snapshot::setRestraintPotential(this_00,0.0);
  Snapshot::setRawPotential(this_00,0.0);
  pMVar1 = SimInfo::beginMolecule(this->info_,&local_158);
  while (pMVar1 != (Molecule *)0x0) {
    ppAVar5 = (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar5 ==
        (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      this_01 = (Atom *)0x0;
    }
    else {
      this_01 = *ppAVar5;
    }
    while (this_01 != (Atom *)0x0) {
      ppAVar5 = ppAVar5 + 1;
      StuntDouble::zeroForcesAndTorques(&this_01->super_StuntDouble);
      if (ppAVar5 ==
          (pMVar1->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        this_01 = (Atom *)0x0;
      }
      else {
        this_01 = *ppAVar5;
      }
    }
    ppRVar6 = (pMVar1->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppRVar6 ==
        (pMVar1->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_02 = (RigidBody *)0x0;
    }
    else {
      this_02 = *ppRVar6;
    }
    while (this_02 != (RigidBody *)0x0) {
      ppRVar6 = ppRVar6 + 1;
      StuntDouble::zeroForcesAndTorques(&this_02->super_StuntDouble);
      if (ppRVar6 ==
          (pMVar1->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_02 = (RigidBody *)0x0;
      }
      else {
        this_02 = *ppRVar6;
      }
    }
    if (this->info_->nGlobalCutoffGroups_ != this->info_->nGlobalAtoms_) {
      ppCVar7 = (pMVar1->cutoffGroups_).
                super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppCVar7 ==
          (pMVar1->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_03 = (CutoffGroup *)0x0;
      }
      else {
        this_03 = *ppCVar7;
      }
      while (this_03 != (CutoffGroup *)0x0) {
        ppCVar7 = ppCVar7 + 1;
        CutoffGroup::updateCOM(this_03);
        if (ppCVar7 ==
            (pMVar1->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_03 = (CutoffGroup *)0x0;
        }
        else {
          this_03 = *ppCVar7;
        }
      }
    }
    pMVar1 = SimInfo::nextMolecule(this->info_,&local_158);
  }
  pMVar2 = &this->virialTensor;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      (pMVar2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4] =
           (pMVar2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4]
           * 0.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar3 = lVar3 + 1;
    pMVar2 = (Mat3x3d *)
             ((pMVar2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar3 != 3);
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0;
  (*this->fDecomp_->_vptr_ForceDecomposition[0x2e])();
  if ((this->doPotentialSelection_ == true) && ((this->evaluator_).isDynamic_ == true)) {
    SelectionEvaluator::evaluate(&local_150,&this->evaluator_);
    lVar3 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar3),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_150.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar3));
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_150.bitsets_);
  }
  return;
}

Assistant:

void ForceManager::preCalculation() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    // forces and potentials are zeroed here, before any are
    // accumulated.

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    fDecomp_->setSnapshot(snap);

    snap->setBondPotential(0.0);
    snap->setBendPotential(0.0);
    snap->setTorsionPotential(0.0);
    snap->setInversionPotential(0.0);

    potVec zeroPot(0.0);
    snap->setLongRangePotentials(zeroPot);

    snap->setExcludedPotentials(zeroPot);
    if (doPotentialSelection_) snap->setSelectionPotentials(zeroPot);

    snap->setSelfPotentials(0.0);
    snap->setRestraintPotential(0.0);
    snap->setRawPotential(0.0);

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        atom->zeroForcesAndTorques();
      }

      // change the positions of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->zeroForcesAndTorques();
      }

      if (info_->getNGlobalCutoffGroups() != info_->getNGlobalAtoms()) {
        for (cg = mol->beginCutoffGroup(ci); cg != NULL;
             cg = mol->nextCutoffGroup(ci)) {
          // calculate the center of mass of cutoff group
          cg->updateCOM();
        }
      }
    }

    // Zero out the virial tensor
    virialTensor *= 0.0;
    // Zero out the heatFlux
    fDecomp_->setHeatFlux(Vector3d(0.0));

    if (doPotentialSelection_) {
      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }
    }
  }